

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_dump(opj_j2k_v2_t *p_j2k,OPJ_INT32 flag,FILE *out_stream)

{
  opj_tcp_v2_t *poVar1;
  opj_tccp_t *poVar2;
  opj_codestream_index_t *poVar3;
  opj_marker_info_t *poVar4;
  opj_tp_index_t *poVar5;
  uint uVar6;
  opj_tile_index_t *poVar7;
  long lVar8;
  size_t __size;
  char *__ptr;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long local_68;
  long local_50;
  
  if ((flag & 0x180U) == 0) {
    if (((flag & 1U) != 0) && (p_j2k->m_private_image != (opj_image_t *)0x0)) {
      j2k_dump_image_header(p_j2k->m_private_image,0,out_stream);
    }
    if ((flag & 2U) != 0) {
      fwrite("Codestream info from main header: {\n",0x24,1,(FILE *)out_stream);
      fprintf((FILE *)out_stream,"\t tx0=%d, ty0=%d\n",(ulong)(p_j2k->m_cp).tx0,
              (ulong)(p_j2k->m_cp).ty0);
      fprintf((FILE *)out_stream,"\t tdx=%d, tdy=%d\n",(ulong)(p_j2k->m_cp).tdx,
              (ulong)(p_j2k->m_cp).tdy);
      fprintf((FILE *)out_stream,"\t tw=%d, th=%d\n",(ulong)(p_j2k->m_cp).tw,(ulong)(p_j2k->m_cp).th
             );
      poVar1 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
      if (poVar1 != (opj_tcp_v2_t *)0x0) {
        lVar10 = (long)(int)p_j2k->m_private_image->numcomps;
        fwrite("\t default tile {\n",0x11,1,(FILE *)out_stream);
        fprintf((FILE *)out_stream,"\t\t csty=%#x\n",(ulong)poVar1->csty);
        fprintf((FILE *)out_stream,"\t\t prg=%#x\n",(ulong)(uint)poVar1->prg);
        fprintf((FILE *)out_stream,"\t\t numlayers=%d\n",(ulong)poVar1->numlayers);
        fprintf((FILE *)out_stream,"\t\t mct=%x\n",(ulong)poVar1->mct);
        if (0 < lVar10) {
          local_68 = 0x3b0;
          local_50 = 0x20;
          lVar8 = 0;
          do {
            poVar2 = poVar1->tccps;
            fprintf((FILE *)out_stream,"\t\t comp %d {\n");
            fprintf((FILE *)out_stream,"\t\t\t csty=%#x\n",(ulong)poVar2[lVar8].csty);
            fprintf((FILE *)out_stream,"\t\t\t numresolutions=%d\n",
                    (ulong)poVar2[lVar8].numresolutions);
            fprintf((FILE *)out_stream,"\t\t\t cblkw=2^%d\n",(ulong)poVar2[lVar8].cblkw);
            fprintf((FILE *)out_stream,"\t\t\t cblkh=2^%d\n",(ulong)poVar2[lVar8].cblkh);
            fprintf((FILE *)out_stream,"\t\t\t cblksty=%#x\n",(ulong)poVar2[lVar8].cblksty);
            fprintf((FILE *)out_stream,"\t\t\t qmfbid=%d\n",(ulong)poVar2[lVar8].qmfbid);
            fwrite("\t\t\t preccintsize (w,h)=",0x17,1,(FILE *)out_stream);
            if (poVar2[lVar8].numresolutions != 0) {
              uVar12 = 0;
              do {
                fprintf((FILE *)out_stream,"(%d,%d) ",
                        (ulong)*(uint *)((long)poVar2 + uVar12 * 4 + local_68 + -0x84),
                        (ulong)*(uint *)((long)poVar2->stepsizes + uVar12 * 4 + local_68 + -0x1c));
                uVar12 = uVar12 + 1;
              } while (uVar12 < poVar2[lVar8].numresolutions);
            }
            fputc(10,(FILE *)out_stream);
            fprintf((FILE *)out_stream,"\t\t\t qntsty=%d\n",(ulong)poVar2[lVar8].qntsty);
            fprintf((FILE *)out_stream,"\t\t\t numgbits=%d\n",(ulong)poVar2[lVar8].numgbits);
            fwrite("\t\t\t stepsizes (m,e)=",0x14,1,(FILE *)out_stream);
            uVar6 = 1;
            if (poVar2[lVar8].qntsty != 1) {
              uVar6 = poVar2[lVar8].numresolutions * 3 - 2;
            }
            if (0 < (int)uVar6) {
              uVar12 = 0;
              do {
                fprintf((FILE *)out_stream,"(%d,%d) ",
                        (ulong)*(uint *)((long)poVar2->stepsizes + uVar12 * 8 + local_50 + -0x1c),
                        (ulong)*(uint *)((long)&poVar2->stepsizes[uVar12 - 4].expn + local_50));
                uVar12 = uVar12 + 1;
              } while (uVar6 != uVar12);
            }
            fputc(10,(FILE *)out_stream);
            fprintf((FILE *)out_stream,"\t\t\t roishift=%d\n",(ulong)(uint)poVar2[lVar8].roishift);
            fwrite("\t\t }\n",5,1,(FILE *)out_stream);
            lVar8 = lVar8 + 1;
            local_68 = local_68 + 0x438;
            local_50 = local_50 + 0x438;
          } while (lVar8 != lVar10);
        }
        fwrite("\t }\n",4,1,(FILE *)out_stream);
      }
      fwrite("}\n",2,1,(FILE *)out_stream);
    }
    if ((flag & 0x10U) == 0) {
      return;
    }
    poVar3 = p_j2k->cstr_index;
    fwrite("Codestream index from main header: {\n",0x25,1,(FILE *)out_stream);
    fprintf((FILE *)out_stream,
            "\t Main header start position=%lld\n\t Main header end position=%lld\n",
            poVar3->main_head_start,poVar3->main_head_end);
    fwrite("\t Marker list: {\n",0x11,1,(FILE *)out_stream);
    if ((poVar3->marker != (opj_marker_info_t *)0x0) && (poVar3->marknum != 0)) {
      lVar10 = 0x10;
      uVar12 = 0;
      do {
        poVar4 = poVar3->marker;
        fprintf((FILE *)out_stream,"\t\t type=%#x, pos=%lld, len=%d\n",
                (ulong)*(ushort *)((long)poVar4 + lVar10 + -0x10),
                *(undefined8 *)((long)poVar4 + lVar10 + -8),
                (ulong)*(uint *)((long)&poVar4->type + lVar10));
        uVar12 = uVar12 + 1;
        lVar10 = lVar10 + 0x18;
      } while (uVar12 < poVar3->marknum);
    }
    fwrite("\t }\n",4,1,(FILE *)out_stream);
    if (poVar3->tile_index != (opj_tile_index_t *)0x0) {
      fwrite("\t Tile index: {\n",0x10,1,(FILE *)out_stream);
      if (poVar3->nb_of_tiles != 0) {
        uVar12 = 0;
        do {
          uVar9 = (ulong)poVar3->tile_index[uVar12].nb_tps;
          fprintf((FILE *)out_stream,"\t\t nb of tile-part in tile [%d]=%d\n",uVar12,uVar9);
          if ((uVar9 != 0) && (poVar3->tile_index[uVar12].tp_index != (opj_tp_index_t *)0x0)) {
            lVar10 = 0x10;
            uVar11 = 0;
            do {
              poVar5 = poVar3->tile_index[uVar12].tp_index;
              fprintf((FILE *)out_stream,
                      "\t\t\t tile-part[%d]: star_pos=%lld, end_header=%lld, end_pos=%lld.\n",
                      uVar11 & 0xffffffff,*(undefined8 *)((long)poVar5 + lVar10 + -0x10),
                      *(undefined8 *)((long)poVar5 + lVar10 + -8),
                      *(undefined8 *)((long)&poVar5->start_pos + lVar10));
              uVar11 = uVar11 + 1;
              lVar10 = lVar10 + 0x18;
            } while (uVar9 != uVar11);
          }
          poVar7 = poVar3->tile_index;
          if ((poVar7[uVar12].marker != (opj_marker_info_t *)0x0) && (poVar7[uVar12].marknum != 0))
          {
            lVar10 = 0x10;
            uVar9 = 0;
            do {
              poVar4 = poVar7[uVar12].marker;
              fprintf((FILE *)out_stream,"\t\t type=%#x, pos=%lld, len=%d\n",
                      (ulong)*(ushort *)((long)poVar4 + lVar10 + -0x10),
                      *(undefined8 *)((long)poVar4 + lVar10 + -8),
                      (ulong)*(uint *)((long)&poVar4->type + lVar10));
              uVar9 = uVar9 + 1;
              poVar7 = poVar3->tile_index;
              lVar10 = lVar10 + 0x18;
            } while (uVar9 < poVar7[uVar12].marknum);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < poVar3->nb_of_tiles);
      }
      fwrite("\t }\n",4,1,(FILE *)out_stream);
    }
    __ptr = "}\n";
    __size = 2;
  }
  else {
    __ptr = "Wrong flag\n";
    __size = 0xb;
  }
  fwrite(__ptr,__size,1,(FILE *)out_stream);
  return;
}

Assistant:

void j2k_dump (opj_j2k_v2_t* p_j2k, OPJ_INT32 flag, FILE* out_stream)
{
	/* Check if the flag is compatible with j2k file*/
	if ( (flag & OPJ_JP2_INFO) || (flag & OPJ_JP2_IND)){
		fprintf(out_stream, "Wrong flag\n");
		return;
	}

	/* Dump the image_header */
	if (flag & OPJ_IMG_INFO){
		if (p_j2k->m_private_image)
			j2k_dump_image_header(p_j2k->m_private_image, 0, out_stream);
	}

	/* Dump the codestream info from main header */
	if (flag & OPJ_J2K_MH_INFO){
		j2k_dump_MH_info(p_j2k, out_stream);
	}


	/* Dump the codestream info of the current tile */
	if (flag & OPJ_J2K_TH_INFO){

	}

	/* Dump the codestream index from main header */
	if (flag & OPJ_J2K_MH_IND){
		j2k_dump_MH_index(p_j2k, out_stream);
	}

	/* Dump the codestream index of the current tile */
	if (flag & OPJ_J2K_TH_IND){

	}

}